

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * rbuStrndup(char *zStr,int *pRc)

{
  size_t sVar1;
  size_t nCopy;
  char *zRet;
  int *pRc_local;
  char *zStr_local;
  
  nCopy = 0;
  if (zStr != (char *)0x0) {
    sVar1 = strlen(zStr);
    nCopy = (size_t)sqlite3_malloc64(sVar1 + 1);
    if ((void *)nCopy == (void *)0x0) {
      *pRc = 7;
    }
    else {
      memcpy((void *)nCopy,zStr,sVar1 + 1);
    }
  }
  return (char *)nCopy;
}

Assistant:

static char *rbuStrndup(const char *zStr, int *pRc){
  char *zRet = 0;

  assert( *pRc==SQLITE_OK );
  if( zStr ){
    size_t nCopy = strlen(zStr) + 1;
    zRet = (char*)sqlite3_malloc64(nCopy);
    if( zRet ){
      memcpy(zRet, zStr, nCopy);
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }

  return zRet;
}